

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint32_t univ_bits,uint32_t capa_bits)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint32_t uVar3;
  uint *puVar4;
  compact_vector *this_00;
  uint64_t uVar5;
  undefined8 uVar6;
  compact_vector *pcVar7;
  uint32_t in_ESI;
  undefined8 *in_RDI;
  size_p2 sVar8;
  undefined1 auVar9 [16];
  compact_vector *in_stack_ffffffffffffff40;
  size_p2 *this_01;
  uint32_t univ_bits_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined8 *init;
  uint64_t in_stack_ffffffffffffff68;
  compact_vector *in_stack_ffffffffffffff70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  size_p2 local_50;
  size_p2 local_40 [2];
  size_p2 local_20;
  uint local_10;
  uint32_t local_c;
  
  local_c = in_ESI;
  bijective_hash::split_mix_hasher::split_mix_hasher((split_mix_hasher *)0x136cdf);
  init = in_RDI + 3;
  compact_vector::compact_vector(in_stack_ffffffffffffff40);
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  size_p2::size_p2((size_p2 *)(in_RDI + 0xb));
  size_p2::size_p2((size_p2 *)(in_RDI + 0xd));
  size_p2::size_p2((size_p2 *)(in_RDI + 0xf));
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  size_p2::size_p2(&local_20,local_c);
  in_RDI[0xb] = local_20._0_8_;
  in_RDI[0xc] = local_20.mask_;
  puVar4 = std::max<unsigned_int>(&min_capa_bits,&local_10);
  size_p2::size_p2(local_40,*puVar4);
  this_01 = (size_p2 *)(in_RDI + 0xd);
  in_RDI[0xd] = local_40[0]._0_8_;
  in_RDI[0xe] = local_40[0].mask_;
  uVar2 = size_p2::bits((size_p2 *)(in_RDI + 0xb));
  uVar3 = size_p2::bits(this_01);
  univ_bits_00 = (uint32_t)((ulong)this_01 >> 0x20);
  size_p2::size_p2(&local_50,uVar2 - uVar3);
  *(size_p2 *)(in_RDI + 0xf) = local_50;
  in_RDI[0x11] = 9;
  sVar8 = local_50;
  this_00 = (compact_vector *)size_p2::mask((size_p2 *)(in_RDI + 0xf));
  in_RDI[0x12] = ~((long)this_00 << ((ulong)*(byte *)(in_RDI + 0x11) & 0x3f));
  uVar5 = size_p2::size((size_p2 *)(in_RDI + 0xd));
  auVar1 = vcvtusi2sd_avx512f((undefined1  [16])sVar8,uVar5 * 0x50);
  auVar9._0_8_ = auVar1._0_8_ / 100.0;
  auVar9._8_8_ = auVar1._8_8_;
  uVar6 = vcvttsd2usi_avx512f(auVar9);
  in_RDI[10] = uVar6;
  size_p2::bits((size_p2 *)(in_RDI + 0xb));
  bijective_hash::split_mix_hasher::split_mix_hasher
            ((split_mix_hasher *)CONCAT44(uVar2,in_stack_ffffffffffffff50),univ_bits_00);
  in_RDI[2] = local_58;
  *in_RDI = local_68;
  in_RDI[1] = uStack_60;
  pcVar7 = (compact_vector *)size_p2::size((size_p2 *)(in_RDI + 0xd));
  size_p2::bits((size_p2 *)(in_RDI + 0xf));
  compact_vector::compact_vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(uint32_t)((ulong)in_RDI >> 0x20),
             (uint64_t)init);
  compact_vector::operator=(this_00,pcVar7);
  compact_vector::~compact_vector((compact_vector *)0x136edf);
  return;
}

Assistant:

explicit compact_hash_table(uint32_t univ_bits, uint32_t capa_bits = min_capa_bits) {
        univ_size_ = size_p2{univ_bits};
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};

        assert(capa_size_.bits() <= univ_size_.bits());

        quo_size_ = size_p2{univ_size_.bits() - capa_size_.bits()};
        quo_shift_ = 2 + val_bits;
        quo_invmask_ = ~(quo_size_.mask() << quo_shift_);

        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);

        hasher_ = Hasher{univ_size_.bits()};
        table_ = compact_vector{capa_size_.size(), quo_size_.bits() + val_bits + 2, (val_mask << 2) | 1ULL};
    }